

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::SSBOLayoutCase::checkLayoutIndices(SSBOLayoutCase *this,BufferLayout *layout)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  pointer pBVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  pointer pBVar10;
  uint local_1c0;
  undefined1 local_1b0 [384];
  
  pTVar3 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  uVar6 = (int)((long)(layout->bufferVars).
                      super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(layout->bufferVars).
                      super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x38e38e39;
  local_1c0 = (uint)((ulong)((long)(layout->blocks).
                                   super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(layout->blocks).
                                  super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if ((int)uVar6 < 1) {
    bVar5 = true;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar9 = (ulong)(uVar6 & 0x7fffffff);
    bVar5 = true;
    lVar7 = 0;
    do {
      pBVar4 = (layout->bufferVars).
               super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = *(int *)((long)&pBVar4->blockNdx + lVar7);
      if ((iVar2 < 0) || ((int)local_1c0 <= iVar2)) {
        local_1b0._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Error: Invalid block index in buffer variable \'",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,*(char **)((long)&(pBVar4->name)._M_dataplus._M_p + lVar7),
                   *(long *)((long)&(pBVar4->name)._M_string_length + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        bVar5 = false;
      }
      lVar7 = lVar7 + 0x48;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (0 < (int)local_1c0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar9 = 0;
    do {
      pBVar10 = (layout->blocks).
                super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = *(int **)&pBVar10[uVar9].activeVarIndices.
                         super__Vector_base<int,_std::allocator<int>_>;
      if (piVar8 != *(pointer *)
                     ((long)&pBVar10[uVar9].activeVarIndices.
                             super__Vector_base<int,_std::allocator<int>_> + 8)) {
        pBVar10 = pBVar10 + uVar9;
        do {
          if ((*piVar8 < 0) || ((int)uVar6 <= *piVar8)) {
            local_1b0._0_8_ = pTVar3;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Error: Invalid active variable index ",0x25);
            std::ostream::operator<<(poVar1,*piVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," in block \'",0xb)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(pBVar10->name)._M_dataplus._M_p,
                       (pBVar10->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            bVar5 = false;
          }
          piVar8 = piVar8 + 1;
        } while (piVar8 != *(pointer *)
                            ((long)&(pBVar10->activeVarIndices).
                                    super__Vector_base<int,_std::allocator<int>_> + 8));
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (local_1c0 & 0x7fffffff));
  }
  return bVar5;
}

Assistant:

bool SSBOLayoutCase::checkLayoutIndices (const BufferLayout& layout) const
{
	TestLog&	log			= m_testCtx.getLog();
	int			numVars		= (int)layout.bufferVars.size();
	int			numBlocks	= (int)layout.blocks.size();
	bool		isOk		= true;

	// Check variable block indices.
	for (int varNdx = 0; varNdx < numVars; varNdx++)
	{
		const BufferVarLayoutEntry& bufVar = layout.bufferVars[varNdx];

		if (bufVar.blockNdx < 0 || !deInBounds32(bufVar.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in buffer variable '" << bufVar.name << "'" << TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active variables.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator varNdxIter = block.activeVarIndices.begin(); varNdxIter != block.activeVarIndices.end(); varNdxIter++)
		{
			if (!deInBounds32(*varNdxIter, 0, numVars))
			{
				log << TestLog::Message << "Error: Invalid active variable index " << *varNdxIter << " in block '" << block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}